

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<kj::Own<kj::AsyncIoStream>_>
kj::anon_unknown_30::NetworkAddressImpl::connectImpl
          (LowLevelAsyncIoProvider *lowLevel,NetworkFilter *filter,
          ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs)

{
  size_t sVar1;
  PromiseNode *extraout_RDX;
  Promise<kj::Own<kj::AsyncIoStream>_> PVar2;
  undefined1 local_71 [9];
  Exception *local_68;
  NetworkFilter *local_60;
  Promise<kj::Own<kj::AsyncIoStream>_> local_58 [2];
  Fault local_38;
  Fault f;
  NetworkFilter *filter_local;
  LowLevelAsyncIoProvider *lowLevel_local;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs_local;
  
  lowLevel_local = (LowLevelAsyncIoProvider *)addrs.size_;
  f.exception = (Exception *)addrs.ptr;
  addrs_local.size_ = (size_t)lowLevel;
  sVar1 = ArrayPtr<kj::(anonymous_namespace)::SocketAddress>::size
                    ((ArrayPtr<kj::(anonymous_namespace)::SocketAddress> *)&lowLevel_local);
  if (sVar1 != 0) {
    local_71._1_8_ = &lowLevel_local;
    local_68 = f.exception;
    local_60 = filter;
    evalNow<kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>)::_lambda()_1_>
              ((kj *)local_58,(anon_class_24_3_40938c43 *)(local_71 + 1));
    Promise<kj::Own<kj::AsyncIoStream>>::
    then<kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>)::_lambda(kj::Own<kj::AsyncIoStream>&&)_1_,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>)::_lambda(kj::Exception&&)_1_>
              ((Promise<kj::Own<kj::AsyncIoStream>> *)lowLevel,(Type *)local_58,(Type *)local_71);
    Promise<kj::Own<kj::AsyncIoStream>_>::~Promise(local_58);
    PVar2.super_PromiseBase.node.ptr = extraout_RDX;
    PVar2.super_PromiseBase.node.disposer = (Disposer *)lowLevel;
    return (Promise<kj::Own<kj::AsyncIoStream>_>)PVar2.super_PromiseBase.node;
  }
  kj::_::Debug::Fault::Fault
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x4de,FAILED,"addrs.size() > 0","");
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

static Promise<Own<AsyncIoStream>> connectImpl(
      LowLevelAsyncIoProvider& lowLevel,
      LowLevelAsyncIoProvider::NetworkFilter& filter,
      ArrayPtr<SocketAddress> addrs) {
    KJ_ASSERT(addrs.size() > 0);

    return kj::evalNow([&]() -> Promise<Own<AsyncIoStream>> {
      if (!addrs[0].allowedBy(filter)) {
        return KJ_EXCEPTION(FAILED, "connect() blocked by restrictPeers()");
      } else {
        int fd = addrs[0].socket(SOCK_STREAM);
        return lowLevel.wrapConnectingSocketFd(
            fd, addrs[0].getRaw(), addrs[0].getRawSize(), NEW_FD_FLAGS);
      }
    }).then([](Own<AsyncIoStream>&& stream) -> Promise<Own<AsyncIoStream>> {
      // Success, pass along.
      return kj::mv(stream);
    }, [&lowLevel,&filter,addrs](Exception&& exception) mutable -> Promise<Own<AsyncIoStream>> {
      // Connect failed.
      if (addrs.size() > 1) {
        // Try the next address instead.
        return connectImpl(lowLevel, filter, addrs.slice(1, addrs.size()));
      } else {
        // No more addresses to try, so propagate the exception.
        return kj::mv(exception);
      }
    });
  }